

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O3

int Gia_ManConstructFromMap
              (Gia_Man_t *pNew,Vec_Int_t *vGates,int nVars,Vec_Int_t *vUsed,Vec_Int_t *vCopy,
              int fHash)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  int **ppiVar10;
  
  uVar4 = vGates->nSize;
  uVar3 = (ulong)(int)uVar4;
  if ((long)uVar3 < 1) {
    __assert_fail("p->nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x203,"int Vec_IntEntryLast(Vec_Int_t *)");
  }
  if (vUsed->nSize != nVars) {
    __assert_fail("Vec_IntSize(vUsed) == nVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub.c"
                  ,0x20f,
                  "int Gia_ManConstructFromMap(Gia_Man_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, int)"
                 );
  }
  if (uVar4 == 1) {
    __assert_fail("Vec_IntSize(vGates) > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub.c"
                  ,0x210,
                  "int Gia_ManConstructFromMap(Gia_Man_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, int)"
                 );
  }
  if ((uVar3 & 1) == 0) {
    __assert_fail("Vec_IntSize(vGates) % 2 == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub.c"
                  ,0x211,
                  "int Gia_ManConstructFromMap(Gia_Man_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, int)"
                 );
  }
  if (-1 < vGates->pArray[uVar3 - 1]) {
    if (((uint)vGates->pArray[uVar3 - 1] >> 1) - nVars != (uVar4 >> 1) - 1) {
      __assert_fail("Abc_Lit2Var(iTopLit)-nVars == Vec_IntSize(vGates)/2-1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub.c"
                    ,0x212,
                    "int Gia_ManConstructFromMap(Gia_Man_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, int)"
                   );
    }
    vCopy->nSize = 0;
    iVar2 = vGates->nSize;
    uVar4 = 0;
    if (1 < iVar2) {
      lVar7 = 1;
      do {
        uVar4 = vGates->pArray[lVar7 + -1];
        if (((int)uVar4 < 0) || (uVar1 = vGates->pArray[lVar7], (int)uVar1 < 0)) goto LAB_007a4720;
        uVar8 = uVar4 >> 1;
        uVar5 = uVar8 - nVars;
        if ((int)uVar8 < nVars) {
          ppiVar10 = &vUsed->pArray;
          uVar5 = uVar8;
          if (vUsed->nSize <= (int)uVar8) goto LAB_007a46e2;
        }
        else if (((int)uVar5 < 0) || (ppiVar10 = &vCopy->pArray, vCopy->nSize <= (int)uVar5))
        goto LAB_007a46e2;
        uVar9 = uVar1 >> 1;
        uVar5 = (*ppiVar10)[uVar5];
        uVar6 = uVar9 - nVars;
        if ((int)uVar9 < nVars) {
          ppiVar10 = &vUsed->pArray;
          uVar6 = uVar9;
          if (vUsed->nSize <= (int)uVar9) goto LAB_007a46e2;
        }
        else if (((int)uVar6 < 0) || (ppiVar10 = &vCopy->pArray, vCopy->nSize <= (int)uVar6))
        goto LAB_007a46e2;
        uVar6 = (*ppiVar10)[uVar6];
        if (uVar8 < uVar9) {
          if (fHash == 0) {
            if (((int)uVar5 < 0) || ((int)uVar6 < 0)) goto LAB_007a4701;
            uVar4 = Gia_ManAppendAnd(pNew,uVar5 ^ uVar4 & 1,uVar6 ^ uVar1 & 1);
          }
          else {
            if (((int)uVar5 < 0) || ((int)uVar6 < 0)) goto LAB_007a4701;
            uVar4 = Gia_ManHashAnd(pNew,uVar5 ^ uVar4 & 1,uVar6 ^ uVar1 & 1);
          }
        }
        else {
          if (uVar8 <= uVar9) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub.c"
                          ,0x22a,
                          "int Gia_ManConstructFromMap(Gia_Man_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, int)"
                         );
          }
          if ((uVar4 & 1) != 0) {
            __assert_fail("!Abc_LitIsCompl(iLit0)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub.c"
                          ,0x223,
                          "int Gia_ManConstructFromMap(Gia_Man_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, int)"
                         );
          }
          if ((uVar1 & 1) != 0) {
            __assert_fail("!Abc_LitIsCompl(iLit1)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub.c"
                          ,0x224,
                          "int Gia_ManConstructFromMap(Gia_Man_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, int)"
                         );
          }
          if (fHash == 0) {
            if (((int)uVar5 < 0) || ((int)uVar6 < 0)) {
LAB_007a4701:
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                            ,0x132,"int Abc_LitNotCond(int, int)");
            }
            uVar4 = Gia_ManAppendAnd(pNew,uVar5 ^ 1,uVar6);
            uVar1 = Gia_ManAppendAnd(pNew,uVar5,uVar6 ^ 1);
            if (((int)uVar4 < 0) || ((int)uVar1 < 0)) {
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                            ,0x131,"int Abc_LitNot(int)");
            }
            uVar4 = Gia_ManAppendAnd(pNew,uVar4 ^ 1,uVar1 ^ 1);
            if ((int)uVar4 < 0) goto LAB_007a4701;
            uVar4 = uVar4 ^ 1;
          }
          else {
            if (((int)uVar5 < 0) || ((int)uVar6 < 0)) goto LAB_007a4701;
            uVar4 = Gia_ManHashXor(pNew,uVar5,uVar6);
          }
        }
        Vec_IntPush(vCopy,uVar4);
        iVar2 = vGates->nSize;
        lVar7 = lVar7 + 2;
      } while ((int)lVar7 < iVar2);
      uVar4 = vCopy->nSize;
    }
    if (uVar4 != iVar2 / 2) {
      __assert_fail("Vec_IntSize(vCopy) == Vec_IntSize(vGates)/2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub.c"
                    ,0x22d,
                    "int Gia_ManConstructFromMap(Gia_Man_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, int)"
                   );
    }
    if (1 < iVar2) {
      return vCopy->pArray[(ulong)uVar4 - 1];
    }
LAB_007a46e2:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
LAB_007a4720:
  __assert_fail("Lit >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                ,0x12f,"int Abc_Lit2Var(int)");
}

Assistant:

int Gia_ManConstructFromMap( Gia_Man_t * pNew, Vec_Int_t * vGates, int nVars, Vec_Int_t * vUsed, Vec_Int_t * vCopy, int fHash )
{
    int i, iLit0, iLit1, iLitRes, iTopLit = Vec_IntEntryLast( vGates );
    assert( Vec_IntSize(vUsed) == nVars );
    assert( Vec_IntSize(vGates) > 1 );
    assert( Vec_IntSize(vGates) % 2 == 1 );
    assert( Abc_Lit2Var(iTopLit)-nVars == Vec_IntSize(vGates)/2-1 );
    Vec_IntClear( vCopy );
    Vec_IntForEachEntryDouble( vGates, iLit0, iLit1, i )
    {
        int iVar0 = Abc_Lit2Var(iLit0);
        int iVar1 = Abc_Lit2Var(iLit1);
        int iRes0 = iVar0 < nVars ? Vec_IntEntry(vUsed, iVar0) : Vec_IntEntry(vCopy, iVar0 - nVars);
        int iRes1 = iVar1 < nVars ? Vec_IntEntry(vUsed, iVar1) : Vec_IntEntry(vCopy, iVar1 - nVars);
        if ( iVar0 < iVar1 )
        {
            if ( fHash )
                iLitRes = Gia_ManHashAnd( pNew, Abc_LitNotCond(iRes0, Abc_LitIsCompl(iLit0)), Abc_LitNotCond(iRes1, Abc_LitIsCompl(iLit1)) );
            else
                iLitRes = Gia_ManAppendAnd( pNew, Abc_LitNotCond(iRes0, Abc_LitIsCompl(iLit0)), Abc_LitNotCond(iRes1, Abc_LitIsCompl(iLit1)) );
        }
        else if ( iVar0 > iVar1 )
        {
            assert( !Abc_LitIsCompl(iLit0) );
            assert( !Abc_LitIsCompl(iLit1) );
            if ( fHash )
                iLitRes = Gia_ManHashXor( pNew, Abc_LitNotCond(iRes0, Abc_LitIsCompl(iLit0)), Abc_LitNotCond(iRes1, Abc_LitIsCompl(iLit1)) );
            else
                iLitRes = Gia_ManAppendXor( pNew, Abc_LitNotCond(iRes0, Abc_LitIsCompl(iLit0)), Abc_LitNotCond(iRes1, Abc_LitIsCompl(iLit1)) );
        }
        else assert( 0 );
        Vec_IntPush( vCopy, iLitRes );
    }
    assert( Vec_IntSize(vCopy) == Vec_IntSize(vGates)/2 );
    iLitRes = Vec_IntEntry( vCopy, Vec_IntSize(vGates)/2-1 );
    return iLitRes;
}